

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPData
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,void *zipData,size_t zipSize)

{
  ExceptionReporter<GenICam_3_4::RuntimeException> *this_00;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *pRefCount;
  INodeMap *pNodeMap_00;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ExceptionReporter<GenICam_3_4::RuntimeException> *in_RDI;
  INodeMap *pNodeMap;
  CNodeMapFactory nodeMapData;
  gcstring *DeviceName;
  char *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  int SourceLine;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this_01;
  gcstring local_138 [80];
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *local_e8;
  CNodeMapFactory local_e0 [19];
  undefined1 local_cd;
  char local_c0 [192];
  
  SourceLine = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  if (*(long *)&in_RDI->field_0x8 != 0) {
    local_cd = 1;
    this_00 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
              (in_RDI,(char *)this_00,SourceLine,in_stack_fffffffffffffea8);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
              (this_00,local_c0,"Node map already created");
    local_cd = 0;
    __cxa_throw(this_00,&GenICam_3_4::RuntimeException::typeinfo,
                GenICam_3_4::RuntimeException::~RuntimeException);
  }
  GenApi_3_4::CNodeMapFactory::CNodeMapFactory(local_e0,1,in_RSI,in_RDX,0);
  GenICam_3_4::gcstring::gcstring(local_138,"Device");
  pRefCount = (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)
              GenApi_3_4::CNodeMapFactory::CreateNodeMap((gcstring *)local_e0,SUB81(local_138,0));
  GenICam_3_4::gcstring::~gcstring(local_138);
  DeviceName = (gcstring *)&in_RDI->field_0x10;
  this_01 = pRefCount;
  local_e8 = pRefCount;
  pNodeMap_00 = (INodeMap *)operator_new(4);
  *(undefined4 *)pNodeMap_00 = 0;
  Attach(this_01,pNodeMap_00,DeviceName,(int *)pRefCount);
  GenApi_3_4::CNodeMapFactory::~CNodeMapFactory(local_e0);
  return;
}

Assistant:

inline void CNodeMapRefT<TCameraParams>::_LoadXMLFromZIPData(const void* zipData, size_t zipSize)
    {
        // Load the DLL
        if(_Ptr)
            throw RUNTIME_EXCEPTION("Node map already created");

        // Load the XML file
        CNodeMapFactory nodeMapData(ContentType_ZippedXml, zipData, zipSize);

        // First create node map then the reference counter. This prevents a leak in case of bad node map
        INodeMap* pNodeMap = nodeMapData.CreateNodeMap();
        Attach( pNodeMap, _DeviceName, new int( 0 ) );
    }